

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ParseContext::ParseContext<std::__cxx11::string&>
          (ParseContext *this,int depth,bool aliasing,char **start,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char *pcVar1;
  StringPiece local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char **start_local;
  bool aliasing_local;
  ParseContext *pPStack_10;
  int depth_local;
  ParseContext *this_local;
  
  local_28 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)start;
  start_local._3_1_ = aliasing;
  start_local._4_4_ = depth;
  pPStack_10 = this;
  EpsCopyInputStream::EpsCopyInputStream(&this->super_EpsCopyInputStream,aliasing);
  this->depth_ = start_local._4_4_;
  this->group_depth_ = -0x80000000;
  Data::Data(&this->data_);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_38,local_28);
  pcVar1 = EpsCopyInputStream::InitFrom(&this->super_EpsCopyInputStream,local_38);
  *(char **)args_local = pcVar1;
  return;
}

Assistant:

ParseContext(int depth, bool aliasing, const char** start, T&&... args)
      : EpsCopyInputStream(aliasing), depth_(depth) {
    *start = InitFrom(std::forward<T>(args)...);
  }